

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

NumberParsingStatus __thiscall
QTextStreamPrivate::getNumber(QTextStreamPrivate *this,qulonglong *ret)

{
  QLocale *this_00;
  Data *pDVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  char32_t cVar5;
  uint uVar6;
  int iVar7;
  Category CVar8;
  char32_t ucs4;
  qulonglong qVar9;
  QChar QVar10;
  NumberParsingStatus NVar11;
  QString *pQVar12;
  long lVar13;
  long in_FS_OFFSET;
  qulonglong local_88;
  long local_80;
  QChar local_72;
  QString local_70;
  QString local_58;
  QChar local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  scan(this,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
  consumeLastToken(this);
  iVar7 = (this->params).integerBase;
  if (iVar7 == 0) {
    local_3a.ucs = L'\0';
    bVar4 = getChar(this,&local_3a);
    NVar11 = npsInvalidPrefix;
    if (!bVar4) goto switchD_002fba31_caseD_1;
    if (local_3a.ucs == L'0') {
      local_58.d.d._0_2_ = L'\0';
      bVar4 = getChar(this,(QChar *)&local_58);
      if (!bVar4) {
        *ret = 0;
        NVar11 = npsOk;
        goto switchD_002fba31_caseD_1;
      }
      cVar5 = QChar::toLower((uint)(ushort)local_58.d.d._0_2_);
      QVar10.ucs = (char16_t)cVar5;
      local_58.d.d._0_2_ = QVar10.ucs;
      if (QVar10.ucs == L'b') {
        iVar7 = 2;
      }
      else {
        iVar7 = 0x10;
        if ((cVar5 & 0xffffU) != 0x78) {
          ucs4 = cVar5 & 0xffff;
          if (((uint)(ucs4 + L'\xffffffd0') < 10) ||
             ((0x7f < (uint)(cVar5 & 0xffffU) &&
              (CVar8 = QChar::category(ucs4), CVar8 == Number_DecimalDigit)))) {
            uVar6 = QChar::digitValue(ucs4);
            iVar7 = 8;
            if (uVar6 < 8) goto LAB_002fc214;
          }
          iVar7 = 10;
        }
      }
LAB_002fc214:
      pQVar12 = this->string;
      if (pQVar12 == (QString *)0x0) {
        lVar13 = this->readBufferOffset;
        pQVar12 = &this->readBuffer;
        if (lVar13 == 0) goto LAB_002fc2b3;
        this->readBufferOffset = lVar13 + -1;
        pDVar1 = (this->readBuffer).d.d;
        if ((pDVar1 == (Data *)0x0) ||
           (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(pQVar12,(this->readBuffer).d.size,KeepSize);
        }
        (this->readBuffer).d.ptr[lVar13 + -1] = QVar10.ucs;
      }
      else {
        lVar13 = this->stringOffset;
        if (lVar13 == 0) {
LAB_002fc2b3:
          QString::insert(pQVar12,0,QVar10);
        }
        else {
          this->stringOffset = lVar13 + -1;
          pDVar1 = (pQVar12->d).d;
          if ((pDVar1 == (Data *)0x0) ||
             (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar12,(pQVar12->d).size,KeepSize);
          }
          (pQVar12->d).ptr[lVar13 + -1] = QVar10.ucs;
        }
      }
    }
    else {
      QLocale::negativeSign(&local_58,&this->locale);
      if ((local_58.d.size != 1) || (bVar4 = true, *local_58.d.ptr != local_3a.ucs)) {
        QLocale::positiveSign(&local_70,&this->locale);
        if (((local_70.d.size != 1) || (bVar4 = true, *local_70.d.ptr != local_3a.ucs)) &&
           (bVar4 = true, 9 < (ushort)local_3a.ucs - 0x30)) {
          if ((ushort)local_3a.ucs < 0x80) {
            bVar4 = false;
          }
          else {
            CVar8 = QChar::category((uint)(ushort)local_3a.ucs);
            bVar4 = CVar8 == Number_DecimalDigit;
          }
        }
        piVar3 = (int *)CONCAT62(local_70.d.d._2_6_,local_70.d.d._0_2_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT62(local_70.d.d._2_6_,local_70.d.d._0_2_),2,0x10);
          }
        }
      }
      piVar3 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
        }
      }
      QVar10.ucs = local_3a.ucs;
      iVar7 = 10;
      if (!bVar4) {
        pQVar12 = this->string;
        if (pQVar12 == (QString *)0x0) {
          lVar13 = this->readBufferOffset;
          pQVar12 = &this->readBuffer;
          if (lVar13 != 0) {
            this->readBufferOffset = lVar13 + -1;
            pDVar1 = (this->readBuffer).d.d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar12,(this->readBuffer).d.size,KeepSize);
            }
            (this->readBuffer).d.ptr[lVar13 + -1] = QVar10.ucs;
            goto switchD_002fba31_caseD_1;
          }
        }
        else {
          lVar13 = this->stringOffset;
          if (lVar13 != 0) {
            this->stringOffset = lVar13 + -1;
            pDVar1 = (pQVar12->d).d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar12,(pQVar12->d).size,KeepSize);
            }
            (pQVar12->d).ptr[lVar13 + -1] = QVar10.ucs;
            goto switchD_002fba31_caseD_1;
          }
        }
        QString::insert(pQVar12,0,local_3a);
        goto switchD_002fba31_caseD_1;
      }
    }
    QVar10.ucs = local_3a.ucs;
    pQVar12 = this->string;
    if (pQVar12 == (QString *)0x0) {
      lVar13 = this->readBufferOffset;
      if (lVar13 == 0) {
        QString::insert(&this->readBuffer,0,local_3a);
      }
      else {
        this->readBufferOffset = lVar13 + -1;
        pDVar1 = (this->readBuffer).d.d;
        if ((pDVar1 == (Data *)0x0) ||
           (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(&this->readBuffer,(this->readBuffer).d.size,KeepSize);
        }
        (this->readBuffer).d.ptr[lVar13 + -1] = QVar10.ucs;
      }
    }
    else {
      lVar13 = this->stringOffset;
      if (lVar13 == 0) {
        QString::insert(pQVar12,0,local_3a);
      }
      else {
        this->stringOffset = lVar13 + -1;
        pDVar1 = (pQVar12->d).d;
        if ((pDVar1 == (Data *)0x0) ||
           (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(pQVar12,(pQVar12->d).size,KeepSize);
        }
        (pQVar12->d).ptr[lVar13 + -1] = QVar10.ucs;
      }
    }
  }
  NVar11 = npsInvalidPrefix;
  switch(iVar7 - 2U >> 1 | (uint)((iVar7 - 2U & 1) != 0) << 0x1f) {
  case 0:
    local_58.d.d._0_2_ = L'\0';
    local_70.d.d._0_2_ = L'\0';
    local_3a.ucs = L'\0';
    bVar4 = getChar(this,(QChar *)&local_58);
    NVar11 = npsInvalidPrefix;
    if ((((!bVar4) || (local_58.d.d._0_2_ != L'0')) ||
        (bVar4 = getChar(this,(QChar *)&local_70), !bVar4)) ||
       (cVar5 = QChar::toLower((uint)(ushort)local_70.d.d._0_2_), (short)cVar5 != 0x62))
    goto switchD_002fba31_caseD_1;
    bVar4 = getChar(this,&local_3a);
    if (!bVar4) {
LAB_002fc59f:
      ungetChar(this,local_70.d.d._0_2_);
LAB_002fc5ac:
      ungetChar(this,local_58.d.d._0_2_);
      goto LAB_002fc5b9;
    }
    lVar13 = 0;
    qVar9 = 0;
    do {
      QVar10.ucs = local_3a.ucs;
      cVar5 = QChar::toLower((uint)(ushort)local_3a.ucs);
      if (((ushort)cVar5 & 0xfffe) != 0x30) {
        pQVar12 = this->string;
        if (pQVar12 == (QString *)0x0) {
          lVar2 = this->readBufferOffset;
          if (lVar2 == 0) {
            QString::insert(&this->readBuffer,0,QVar10);
          }
          else {
            this->readBufferOffset = lVar2 + -1;
            pDVar1 = (this->readBuffer).d.d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(&this->readBuffer,(this->readBuffer).d.size,KeepSize);
            }
            (this->readBuffer).d.ptr[lVar2 + -1] = QVar10.ucs;
          }
        }
        else {
          lVar2 = this->stringOffset;
          if (lVar2 == 0) {
            QString::insert(pQVar12,0,QVar10);
          }
          else {
            this->stringOffset = lVar2 + -1;
            pDVar1 = (pQVar12->d).d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar12,(pQVar12->d).size,KeepSize);
            }
            (pQVar12->d).ptr[lVar2 + -1] = QVar10.ucs;
          }
        }
        if (lVar13 == 0) goto LAB_002fc59f;
        break;
      }
      qVar9 = (ulong)(uint)(cVar5 & 1) + qVar9 * 2;
      bVar4 = getChar(this,&local_3a);
      lVar13 = lVar13 + -1;
    } while (bVar4);
    break;
  default:
    goto switchD_002fba31_caseD_1;
  case 3:
    local_58.d.d._0_2_ = L'\0';
    local_70.d.d._0_2_ = L'\0';
    bVar4 = getChar(this,(QChar *)&local_58);
    NVar11 = npsInvalidPrefix;
    if ((!bVar4) || (local_58.d.d._0_2_ != L'0')) goto switchD_002fba31_caseD_1;
    bVar4 = getChar(this,(QChar *)&local_70);
    if (!bVar4) goto LAB_002fc5ac;
    lVar13 = 0;
    qVar9 = 0;
    do {
      QVar10.ucs = local_70.d.d._0_2_;
      cVar5 = QChar::toLower((uint)(ushort)local_70.d.d._0_2_);
      if ((cVar5 & 0xfff8U) != 0x30) {
        pQVar12 = this->string;
        if (pQVar12 == (QString *)0x0) {
          lVar2 = this->readBufferOffset;
          if (lVar2 == 0) {
            QString::insert(&this->readBuffer,0,QVar10);
          }
          else {
            this->readBufferOffset = lVar2 + -1;
            pDVar1 = (this->readBuffer).d.d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(&this->readBuffer,(this->readBuffer).d.size,KeepSize);
            }
            (this->readBuffer).d.ptr[lVar2 + -1] = QVar10.ucs;
          }
        }
        else {
          lVar2 = this->stringOffset;
          if (lVar2 == 0) {
            QString::insert(pQVar12,0,QVar10);
          }
          else {
            this->stringOffset = lVar2 + -1;
            pDVar1 = (pQVar12->d).d;
            if ((pDVar1 == (Data *)0x0) ||
               (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar12,(pQVar12->d).size,KeepSize);
            }
            (pQVar12->d).ptr[lVar2 + -1] = QVar10.ucs;
          }
        }
        if (lVar13 == 0) goto LAB_002fc5ac;
        break;
      }
      qVar9 = (ulong)(uint)((cVar5 & 0x37U) - 0x30) + qVar9 * 8;
      bVar4 = getChar(this,(QChar *)&local_70);
      lVar13 = lVar13 + -1;
    } while (bVar4);
    break;
  case 4:
    local_3a.ucs = L'\0';
    bVar4 = getChar(this,&local_3a);
    if (!bVar4) goto LAB_002fc5b9;
    this_00 = &this->locale;
    QLocale::negativeSign(&local_58,this_00);
    if ((local_58.d.size == 1) && (*local_58.d.ptr == local_3a.ucs)) {
      bVar4 = false;
    }
    else {
      QLocale::positiveSign(&local_70,this_00);
      bVar4 = true;
      if (local_70.d.size == 1) {
        bVar4 = *local_70.d.ptr != local_3a.ucs;
      }
      piVar3 = (int *)CONCAT62(local_70.d.d._2_6_,local_70.d.d._0_2_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT62(local_70.d.d._2_6_,local_70.d.d._0_2_),2,0x10);
        }
      }
    }
    piVar3 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10)
        ;
      }
    }
    QVar10.ucs = local_3a.ucs;
    if (bVar4) {
      if (((ushort)local_3a.ucs - 0x30 < 10) ||
         ((0x7f < (ushort)local_3a.ucs &&
          (CVar8 = QChar::category((uint)(ushort)local_3a.ucs), CVar8 == Number_DecimalDigit)))) {
        iVar7 = QChar::digitValue((uint)(ushort)QVar10.ucs);
        local_88 = (qulonglong)iVar7;
        local_80 = 1;
        goto LAB_002fbe8b;
      }
      pQVar12 = this->string;
      if (pQVar12 == (QString *)0x0) {
        lVar13 = this->readBufferOffset;
        pQVar12 = &this->readBuffer;
        if (lVar13 == 0) goto LAB_002fc4c1;
        this->readBufferOffset = lVar13 + -1;
        pDVar1 = (this->readBuffer).d.d;
        if ((pDVar1 == (Data *)0x0) ||
           (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(pQVar12,(this->readBuffer).d.size,KeepSize);
        }
        (this->readBuffer).d.ptr[lVar13 + -1] = QVar10.ucs;
      }
      else {
        lVar13 = this->stringOffset;
        if (lVar13 == 0) {
LAB_002fc4c1:
          QString::insert(pQVar12,0,QVar10);
        }
        else {
          this->stringOffset = lVar13 + -1;
          pDVar1 = (pQVar12->d).d;
          if ((pDVar1 == (Data *)0x0) ||
             (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar12,(pQVar12->d).size,KeepSize);
          }
          (pQVar12->d).ptr[lVar13 + -1] = QVar10.ucs;
        }
      }
    }
    else {
      local_88 = 0;
      local_80 = 0;
LAB_002fbe8b:
      local_72.ucs = L'\0';
      do {
        while( true ) {
          bVar4 = getChar(this,&local_72);
          QVar10.ucs = local_72.ucs;
          if (!bVar4) goto LAB_002fbfa3;
          if ((9 < (ushort)local_72.ucs - 0x30) &&
             (((ushort)local_72.ucs < 0x80 ||
              (CVar8 = QChar::category((uint)(ushort)local_72.ucs), CVar8 != Number_DecimalDigit))))
          break;
          iVar7 = QChar::digitValue((uint)(ushort)QVar10.ucs);
          local_88 = (long)iVar7 + local_88 * 10;
          local_80 = local_80 + 1;
        }
        QLocale::QLocale((QLocale *)&local_70,C,AnyScript,AnyCountry);
        bVar4 = QLocale::equals(this_00,(QLocale *)&local_70);
        if (bVar4) {
          QLocale::~QLocale((QLocale *)&local_70);
          break;
        }
        QLocale::groupSeparator(&local_58,this_00);
        if (local_58.d.size == 1) {
          bVar4 = *local_58.d.ptr == local_72.ucs;
        }
        else {
          bVar4 = false;
        }
        piVar3 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
          }
        }
        QLocale::~QLocale((QLocale *)&local_70);
      } while (bVar4);
      ungetChar(this,local_72);
LAB_002fbfa3:
      if (local_80 != 0) {
        QLocale::negativeSign(&local_58,this_00);
        if (local_58.d.size == 1) {
          bVar4 = *local_58.d.ptr == local_3a.ucs;
        }
        else {
          bVar4 = false;
        }
        piVar3 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
          }
        }
        qVar9 = -local_88;
        if ((long)local_88 < 1) {
          qVar9 = local_88;
        }
        if (!bVar4) {
          qVar9 = local_88;
        }
        break;
      }
    }
LAB_002fc5b9:
    NVar11 = npsMissingDigit;
    goto switchD_002fba31_caseD_1;
  case 7:
    local_58.d.d._0_2_ = L'\0';
    local_70.d.d._0_2_ = L'\0';
    local_3a.ucs = L'\0';
    bVar4 = getChar(this,(QChar *)&local_58);
    if ((((!bVar4) || (local_58.d.d._0_2_ != L'0')) ||
        (bVar4 = getChar(this,(QChar *)&local_70), !bVar4)) ||
       (cVar5 = QChar::toLower((uint)(ushort)local_70.d.d._0_2_), (short)cVar5 != 0x78))
    goto switchD_002fba31_caseD_1;
    bVar4 = getChar(this,&local_3a);
    if (!bVar4) goto LAB_002fc5b9;
    lVar13 = 0;
    qVar9 = 0;
    do {
      QVar10.ucs = local_3a.ucs;
      uVar6 = (ushort)local_3a.ucs - 0x30;
      if (9 < uVar6) {
        if ((ushort)local_3a.ucs - 0x41 < 6) {
          uVar6 = (ushort)local_3a.ucs - 0x37;
        }
        else {
          if ((ushort)local_3a.ucs - 0x67 < 0xfffffffa) {
            pQVar12 = this->string;
            if (pQVar12 == (QString *)0x0) {
              lVar2 = this->readBufferOffset;
              if (lVar2 == 0) {
                QString::insert(&this->readBuffer,0,local_3a);
              }
              else {
                this->readBufferOffset = lVar2 + -1;
                pDVar1 = (this->readBuffer).d.d;
                if ((pDVar1 == (Data *)0x0) ||
                   (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                  QString::reallocData(&this->readBuffer,(this->readBuffer).d.size,KeepSize);
                }
                (this->readBuffer).d.ptr[lVar2 + -1] = QVar10.ucs;
              }
            }
            else {
              lVar2 = this->stringOffset;
              if (lVar2 == 0) {
                QString::insert(pQVar12,0,local_3a);
              }
              else {
                this->stringOffset = lVar2 + -1;
                pDVar1 = (pQVar12->d).d;
                if ((pDVar1 == (Data *)0x0) ||
                   (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                  QString::reallocData(pQVar12,(pQVar12->d).size,KeepSize);
                }
                (pQVar12->d).ptr[lVar2 + -1] = QVar10.ucs;
              }
            }
            if (lVar13 == 0) goto LAB_002fc5b9;
            break;
          }
          uVar6 = (ushort)local_3a.ucs - 0x57;
        }
      }
      qVar9 = (long)(int)uVar6 + qVar9 * 0x10;
      bVar4 = getChar(this,&local_3a);
      lVar13 = lVar13 + -1;
    } while (bVar4);
  }
  NVar11 = npsOk;
  if (ret != (qulonglong *)0x0) {
    *ret = qVar9;
  }
switchD_002fba31_caseD_1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return NVar11;
  }
  __stack_chk_fail();
}

Assistant:

QTextStreamPrivate::NumberParsingStatus QTextStreamPrivate::getNumber(qulonglong *ret)
{
    scan(nullptr, nullptr, 0, NotSpace);
    consumeLastToken();

    // detect integer encoding
    int base = params.integerBase;
    if (base == 0) {
        QChar ch;
        if (!getChar(&ch))
            return npsInvalidPrefix;
        if (ch == u'0') {
            QChar ch2;
            if (!getChar(&ch2)) {
                // Result is the number 0
                *ret = 0;
                return npsOk;
            }
            ch2 = ch2.toLower();

            if (ch2 == u'x') {
                base = 16;
            } else if (ch2 == u'b') {
                base = 2;
            } else if (ch2.isDigit() && ch2.digitValue() >= 0 && ch2.digitValue() <= 7) {
                base = 8;
            } else {
                base = 10;
            }
            ungetChar(ch2);
        } else if (ch == locale.negativeSign() || ch == locale.positiveSign() || ch.isDigit()) {
            base = 10;
        } else {
            ungetChar(ch);
            return npsInvalidPrefix;
        }
        ungetChar(ch);
        // State of the stream is now the same as on entry
        // (cursor is at prefix),
        // and local variable 'base' has been set appropriately.
    }

    qulonglong val=0;
    switch (base) {
    case 2: {
        QChar pf1, pf2, dig;
        // Parse prefix '0b'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'b')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (n == u'0' || n == u'1') {
                val <<= 1;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf2);
            ungetChar(pf1);
            return npsMissingDigit;
        }
        break;
    }
    case 8: {
        QChar pf, dig;
        // Parse prefix u'0'
        if (!getChar(&pf) || pf != u'0')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (isOctalDigit(n)) {
                val *= 8;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf);
            return npsMissingDigit;
        }
        break;
    }
    case 10: {
        // Parse sign (or first digit)
        QChar sign;
        qsizetype ndigits = 0;
        if (!getChar(&sign))
            return npsMissingDigit;
        if (sign != locale.negativeSign() && sign != locale.positiveSign()) {
            if (!sign.isDigit()) {
                ungetChar(sign);
                return npsMissingDigit;
            }
            val += sign.digitValue();
            ndigits++;
        }
        // Parse digits
        QChar ch;
        while (getChar(&ch)) {
            if (ch.isDigit()) {
                val *= 10;
                val += ch.digitValue();
            } else if (locale != QLocale::c() && ch == locale.groupSeparator()) {
                continue;
            } else {
                ungetChar(ch);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0)
            return npsMissingDigit;
        if (sign == locale.negativeSign()) {
            qlonglong ival = qlonglong(val);
            if (ival > 0)
                ival = -ival;
            val = qulonglong(ival);
        }
        break;
    }
    case 16: {
        QChar pf1, pf2, dig;
        // Parse prefix ' 0x'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'x')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            const int h = fromHex(dig.unicode());
            if (h != -1) {
                val <<= 4;
                val += h;
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            return npsMissingDigit;
        }
        break;
    }
    default:
        // Unsupported integerBase
        return npsInvalidPrefix;
    }

    if (ret)
        *ret = val;
    return npsOk;
}